

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

int replay_match_victim_pedigree_internal(__cilkrts_worker *w,__cilkrts_worker *victim)

{
  replay_entry_t *prVar1;
  replay_entry_t *prVar2;
  bool bVar3;
  int iVar4;
  replay_entry_t *prVar5;
  
  bVar3 = replay_entry_t::match
                    (w->l->replay_list_entry,ped_type_steal,
                     &((*victim->head)->field_9).spawn_helper_pedigree,victim->self);
  iVar4 = 0;
  if (bVar3) {
    prVar5 = w->l->replay_list_entry;
    prVar1 = prVar5;
    if (prVar5->m_type != ped_type_last) {
      do {
        prVar5 = prVar1 + 1;
        if (prVar1[1].m_type != ped_type_orphaned) break;
        prVar2 = prVar1 + 1;
        prVar1 = prVar5;
      } while (prVar2->m_value == -1);
    }
    w->l->replay_list_entry = prVar5;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int replay_match_victim_pedigree_internal(__cilkrts_worker *w, __cilkrts_worker *victim)
{
    // If we don't have a match, return 0
    if (! w->l->replay_list_entry->match(ped_type_steal,
                                             &((*victim->head)->parent_pedigree),
                                             victim->self))
        return 0;

    // Consume this entry
    w->l->replay_list_entry = w->l->replay_list_entry->next_entry();

    // Return success
    return 1;
}